

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezone.cpp
# Opt level: O2

QList<QByteArray> *
set_union(QList<QByteArray> *__return_storage_ptr__,QList<QByteArray> *l1,QList<QByteArray> *l2)

{
  QByteArray *pQVar1;
  QByteArray *pQVar2;
  
  (__return_storage_ptr__->d).size = 0;
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QByteArray *)0x0;
  QList<QByteArray>::reserve(__return_storage_ptr__,(l2->d).size + (l1->d).size);
  pQVar1 = (l1->d).ptr;
  pQVar2 = (l2->d).ptr;
  std::
  __set_union<QList<QByteArray>::const_iterator,QList<QByteArray>::const_iterator,std::back_insert_iterator<QList<QByteArray>>,__gnu_cxx::__ops::_Iter_less_iter>
            (pQVar1,pQVar1 + (l1->d).size,pQVar2,pQVar2 + (l2->d).size,__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

static QList<QByteArray> set_union(const QList<QByteArray> &l1, const QList<QByteArray> &l2)
{
    Q_ASSERT(isUniqueSorted(l1));
    Q_ASSERT(isUniqueSorted(l2));
    QList<QByteArray> result;
    result.reserve(l1.size() + l2.size());
    std::set_union(l1.begin(), l1.end(),
                   l2.begin(), l2.end(),
                   std::back_inserter(result));
    return result;
}